

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

int __thiscall
ON_HistoryRecord::GetPointValues(ON_HistoryRecord *this,int value_id,ON_SimpleArray<ON_3dPoint> *a)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_PointValue *v;
  ON_SimpleArray<ON_3dPoint> *a_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  ON_SimpleArray<ON_3dPoint>::SetCount(a,0);
  pOVar2 = FindValueHelper(this,value_id,5,false);
  if (pOVar2 != (ON_Value *)0x0) {
    ON_SimpleArray<ON_3dPoint>::operator=(a,(ON_SimpleArray<ON_3dPoint> *)(pOVar2 + 1));
  }
  iVar1 = ON_SimpleArray<ON_3dPoint>::Count(a);
  return iVar1;
}

Assistant:

int ON_HistoryRecord::GetPointValues( int value_id, ON_SimpleArray<ON_3dPoint>& a ) const
{
  a.SetCount(0);
  const ON_PointValue* v = static_cast<ON_PointValue*>(FindValueHelper(value_id,ON_Value::point_value,0));
  if ( v )
  {
    a = v->m_value;
  }
  return a.Count();
}